

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O0

second_type
google::protobuf::
FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
          (unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
           *collection,first_type *key)

{
  bool bVar1;
  pointer ppVar2;
  iterator it;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false>
  in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false>
  local_20 [3];
  Message *local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
       ::find(in_stack_ffffffffffffffd8._M_cur,(key_type *)0x42a9cd);
  std::
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  ::end((unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
         *)in_stack_ffffffffffffffd8._M_cur);
  bVar1 = std::__detail::operator==
                    (local_20,(_Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false>
                               *)&stack0xffffffffffffffd8);
  if (bVar1) {
    local_8 = (Message *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false,_false>
                           *)0x42aa08);
    local_8 = ppVar2->second;
  }
  return local_8;
}

Assistant:

typename Collection::value_type::second_type
FindPtrOrNull(Collection& collection,  // NOLINT
              const typename Collection::value_type::first_type& key) {
  typename Collection::iterator it = collection.find(key);
  if (it == collection.end()) {
    return typename Collection::value_type::second_type();
  }
  return it->second;
}